

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void print_atomname(LispPTR index)

{
  uint *local_30;
  PNCell *pnptr;
  DLword *pDStack_18;
  DLword length;
  char *pname;
  LispPTR index_local;
  
  if ((index & 0xfff0000) == 0) {
    local_30 = (uint *)(AtomSpace + (ulong)(index * 5) * 2);
  }
  else {
    local_30 = NativeAligned4FromLAddr(index);
  }
  print_package_name(local_30[4] >> 0x18);
  pDStack_18 = NativeAligned2FromLAddr(*local_30 & 0xfffffff);
  for (pnptr._6_2_ = (ushort)*(byte *)((ulong)pDStack_18 ^ 3);
      pDStack_18 = (DLword *)((long)pDStack_18 + 1), pnptr._6_2_ != 0; pnptr._6_2_ = pnptr._6_2_ - 1
      ) {
    putchar((uint)*(byte *)((ulong)pDStack_18 ^ 3));
  }
  return;
}

Assistant:

void print_atomname(LispPTR index)
/* atomindex */
{
  char *pname;
  DLword length;
  PNCell *pnptr;

  pnptr = (PNCell *)GetPnameCell(index);
  print_package_name(pnptr->pkg_index);
  pname = (char *)NativeAligned2FromLAddr(pnptr->pnamebase);

  length = (DLword)GETBYTE(pname++);

  while (length > 0) {
    putchar(GETBYTE(pname++));
    length--;
  }

}